

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

void __thiscall
Memory::HeapInfo::Initialize
          (HeapInfo *this,Recycler *recycler,
          _func_void_Recycler_ptr_void_ptr_size_t *trackNativeAllocCallBack,
          PageHeapMode pageheapmode,bool captureAllocCallStack,bool captureFreeCallStack)

{
  long lVar1;
  
  Initialize(this,recycler,pageheapmode,captureAllocCallStack,captureFreeCallStack);
  for (lVar1 = 0xd0; lVar1 != 0xa8d0; lVar1 = lVar1 + 0x380) {
    *(_func_void_Recycler_ptr_void_ptr_size_t **)
     ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler + lVar1) =
         trackNativeAllocCallBack;
  }
  for (lVar1 = 0; lVar1 != 0x6580; lVar1 = lVar1 + 0x380) {
    *(_func_void_Recycler_ptr_void_ptr_size_t **)
     ((long)&this->mediumHeapBuckets[0].heapBucket.
             super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
             .super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
             allocatorHead.pfnTrackNativeAllocatedObjectCallBack + lVar1) = trackNativeAllocCallBack
    ;
  }
  return;
}

Assistant:

void
HeapInfo::Initialize(Recycler * recycler, void(*trackNativeAllocCallBack)(Recycler *, void *, size_t)
#ifdef RECYCLER_PAGE_HEAP
, PageHeapMode pageheapmode
, bool captureAllocCallStack
, bool captureFreeCallStack
#endif
)
{
    Initialize(recycler
#ifdef RECYCLER_PAGE_HEAP
        , pageheapmode
        , captureAllocCallStack
        , captureFreeCallStack
#endif
        );

    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].GetBucket<NoBit>().GetAllocator()->SetTrackNativeAllocatedObjectCallBack(trackNativeAllocCallBack);
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].GetBucket<NoBit>().GetAllocator()->SetTrackNativeAllocatedObjectCallBack(trackNativeAllocCallBack);
    }
#endif
}